

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Vec_Wec_t * Gia_MiniAigSuperGates(Mini_Aig_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vMap;
  int *__s;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  
  iVar1 = Mini_AigPoNum(p);
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = iVar1;
  iVar6 = p->nSize / 2;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  vMap->pArray = __s;
  vMap->nSize = iVar6;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar6 << 2);
  }
  iVar7 = 0;
  if (3 < p->nSize) {
    iVar7 = 0;
    lVar9 = 1;
    do {
      iVar6 = Mini_AigNodeIsPi(p,(int)lVar9);
      if (iVar6 != 0) {
        if (vMap->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[lVar9] = iVar7;
        iVar7 = iVar7 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nSize / 2);
  }
  iVar6 = Mini_AigPiNum(p);
  if (iVar7 != iVar6) {
    __assert_fail("Index == Mini_AigPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                  ,0x342,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
  }
  uVar8 = 0;
  if (3 < p->nSize) {
    uVar8 = 0;
    iVar7 = 1;
    do {
      iVar6 = Mini_AigNodeIsPo(p,iVar7);
      if (iVar6 != 0) {
        uVar2 = Mini_AigNodeFanin0(p,iVar7);
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar2 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iFan0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                        ,0x347,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
        }
        if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar5 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        Gia_MiniAigSuperGates_rec(p,uVar2 >> 1,pVVar4 + uVar5,vMap);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < p->nSize / 2);
  }
  uVar2 = Mini_AigPoNum(p);
  if (uVar8 == uVar2) {
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
      vMap->pArray = (int *)0x0;
    }
    free(vMap);
    return pVVar3;
  }
  __assert_fail("Index == Mini_AigPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                ,0x34a,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
}

Assistant:

Vec_Wec_t * Gia_MiniAigSuperGates( Mini_Aig_t * p )
{
    Vec_Wec_t * vRes = Vec_WecStart( Mini_AigPoNum(p) );
    Vec_Int_t * vMap = Vec_IntStartFull( Mini_AigNodeNum(p) );
    int i, Index = 0;
    Mini_AigForEachPi( p, i )
        Vec_IntWriteEntry( vMap, i, Index++ );
    assert( Index == Mini_AigPiNum(p) );
    Index = 0;
    Mini_AigForEachPo( p, i )
    {
        int iFan0 = Mini_AigNodeFanin0( p, i );
        assert( !Abc_LitIsCompl(iFan0) );
        Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), Vec_WecEntry(vRes, Index++), vMap );
    }
    assert( Index == Mini_AigPoNum(p) );
    Vec_IntFree( vMap );
    return vRes;
}